

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t uVar3;
  sysbvm_tuple_t orderedCollection;
  size_t sVar4;
  sysbvm_tokenKind_t sVar5;
  _Bool _Var6;
  ulong uVar7;
  sysbvm_tuple_t sVar8;
  sysbvm_tuple_t sVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  sysbvm_tokenKind_t sVar13;
  ulong uVar14;
  char *cstring;
  code *tokenConversionFunction;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  sysbvm_scannerState_t scannerState;
  anon_struct_16_2_4aef7a3d gcFrame;
  sysbvm_scannerState_t local_a8;
  sysbvm_scannerState_t local_88;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *psStack_40;
  
  psStack_40 = &local_68;
  local_68 = 0;
  sStack_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  sysbvm_stackFrame_pushRecord(&local_58);
  sysbvm_gc_lock(context);
  local_68 = sysbvm_orderedCollection_create(context);
  if ((((sourceCode & 0xf) == 0 && sourceCode != 0) &&
      (uVar7 = *(ulong *)(sourceCode + 0x10), (uVar7 & 0xf) == 0 && uVar7 != 0)) &&
     ((*(uint *)(uVar7 + 8) & 0x300) == 0x200)) {
    uVar7 = *(ulong *)(sourceCode + 0x10);
    local_a8.text = (uint8_t *)(uVar7 + 0x10);
    if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
      local_a8.size = (size_t)*(uint *)(uVar7 + 0xc);
    }
    else {
      local_a8.size = 0;
    }
    local_a8.position = 0;
    local_a8.sourceCode = sourceCode;
    orderedCollection = local_68;
    if (local_a8.size != 0) {
LAB_0013eac9:
      if (local_a8.position < local_a8.size) {
        do {
          uVar7 = local_a8.position + 1;
          if (0x20 < local_a8.text[local_a8.position]) break;
          local_a8.position = uVar7;
        } while (uVar7 != local_a8.size);
      }
      sVar4 = local_a8.position;
      if ((local_a8.position < local_a8.size) && (local_a8.text[local_a8.position] == '#')) {
        uVar15 = 0xffffffff;
        if (local_a8.position + 1 < local_a8.size) {
          uVar15 = (uint)local_a8.text[local_a8.position + 1];
        }
        if (uVar15 == 0x2a) {
          uVar7 = local_a8.position + 2;
          bVar16 = uVar7 < local_a8.size;
          uVar14 = uVar7;
          if (bVar16) {
            local_a8.position = local_a8.position + 4;
            do {
              if (((local_a8.text[local_a8.position - 2] == '*') &&
                  (local_a8.position - 1 < local_a8.size)) &&
                 (bVar17 = bVar16, local_a8.text[local_a8.position - 1] == '#')) goto LAB_0013ec20;
              uVar14 = local_a8.position - 1;
              bVar16 = uVar14 < local_a8.size;
              lVar2 = local_a8.position - local_a8.size;
              local_a8.position = local_a8.position + 1;
              uVar7 = local_a8.size;
            } while (lVar2 != 1);
          }
          local_a8.position = uVar14;
          sVar8 = sysbvm_sourcePosition_createWithIndices(context,local_a8.sourceCode,sVar4,uVar7);
          sVar9 = sysbvm_symbol_internWithCString(context,"Incomplete multiline comment.");
          sVar8 = sysbvm_token_createWithKind(context,SYSBVM_TOKEN_KIND_ERROR,sVar8,sVar9);
          sysbvm_orderedCollection_add(context,orderedCollection,sVar8);
          bVar17 = bVar16;
        }
        else if (uVar15 == 0x23) {
          local_a8.position = local_a8.position + 2;
          do {
            bVar17 = true;
            if (local_a8.size <= local_a8.position) {
LAB_0013ebda:
              bVar16 = true;
              break;
            }
            puVar1 = local_a8.text + local_a8.position;
            local_a8.position = local_a8.position + 1;
            if (*puVar1 == '\n') goto LAB_0013ebda;
            bVar16 = true;
          } while (*puVar1 != '\r');
        }
        else {
          bVar16 = true;
          bVar17 = false;
        }
LAB_0013ec20:
        if ((bVar17) && (bVar16)) goto LAB_0013eac9;
        if (!bVar16) goto LAB_00140110;
      }
      sVar4 = local_a8.position;
      uVar15 = 0xffffffff;
      if (local_a8.position < local_a8.size) {
        uVar15 = (uint)local_a8.text[local_a8.position];
      }
      if (-1 < (int)uVar15) {
        local_88.size = local_a8.size;
        local_88.position = local_a8.position;
        local_88.sourceCode = local_a8.sourceCode;
        local_88.text = local_a8.text;
        if ((uVar15 == 0x5f) || ((uVar15 & 0x7fffffdf) - 0x41 < 0x1a)) {
          do {
            uVar7 = local_a8.position;
            local_a8.position = uVar7 + 1;
            uVar15 = 0xffffffff;
            if (local_a8.position < local_a8.size) {
              uVar15 = (uint)local_a8.text[uVar7 + 1];
            }
          } while (((uVar15 - 0x30 < 10) || (uVar15 == 0x5f)) ||
                  ((uVar15 & 0xffffffdf) - 0x41 < 0x1a));
          if (local_a8.position < local_a8.size) {
            bVar17 = local_a8.text[local_a8.position] == ':';
            bVar16 = true;
            if ((bVar17) && (uVar7 = uVar7 + 2, uVar7 < local_a8.size)) {
              while (local_a8.text[uVar7] == ':') {
                uVar15 = 0xffffffff;
                if (local_a8.position + 2 < local_a8.size) {
                  uVar15 = (uint)local_a8.text[local_a8.position + 2];
                }
                if ((uVar15 != 0x5f) && (0x19 < (uVar15 & 0xffffffdf) - 0x41)) break;
                uVar7 = local_a8.position + 3;
                do {
                  local_a8.position = uVar7;
                  uVar15 = 0xffffffff;
                  bVar16 = local_a8.position < local_a8.size;
                  if (bVar16) {
                    uVar15 = (uint)local_a8.text[local_a8.position];
                  }
                  uVar7 = local_a8.position + 1;
                } while (((uVar15 - 0x30 < 10) || (uVar15 == 0x5f)) ||
                        ((uVar15 & 0xffffffdf) - 0x41 < 0x1a));
                if (local_a8.size <= local_a8.position) goto LAB_0013fdd4;
                bVar17 = local_a8.text[local_a8.position] == ':';
                if ((!bVar17) || (local_a8.size <= uVar7)) break;
              }
            }
            if (bVar16) {
              if (((bVar17) && (local_a8.position + 1 < local_a8.size)) &&
                 (local_a8.text[local_a8.position + 1] == ':')) {
                uVar15 = 0xffffffff;
                if (local_a8.position + 2 < local_a8.size) {
                  uVar15 = (uint)local_a8.text[local_a8.position + 2];
                }
                if ((((uVar15 - 0x21 < 0x3e) &&
                     ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) != 0)) ||
                    (uVar15 == 0x7e)) || (uVar15 == 0x7c)) {
                  local_a8.position = local_a8.position + 3;
                  while( true ) {
                    uVar15 = 0xffffffff;
                    if (local_a8.position < local_a8.size) {
                      uVar15 = (uint)local_a8.text[local_a8.position];
                    }
                    if (((0x3d < uVar15 - 0x21) ||
                        ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) == 0)) &&
                       ((uVar15 != 0x7c && (uVar15 != 0x7e)))) break;
                    local_a8.position = local_a8.position + 1;
                  }
                  sVar8 = sysbvm_sourcePosition_createWithIndices
                                    (context,local_a8.sourceCode,sVar4,local_a8.position);
                  sVar9 = sysbvm_symbol_internWithString
                                    (context,local_a8.position - local_88.position,
                                     (char *)(local_88.text + local_88.position));
                  sVar13 = SYSBVM_TOKEN_KIND_OPERATOR;
                  goto LAB_0013fe12;
                }
              }
              if ((bool)(bVar16 & bVar17)) {
                local_a8.position = local_a8.position + 1;
                sVar5 = SYSBVM_TOKEN_KIND_KEYWORD;
                do {
                  sVar13 = sVar5;
                  _Var6 = sysbvm_scanner_advanceKeyword(&local_a8);
                  sVar4 = local_88.position;
                  sVar5 = SYSBVM_TOKEN_KIND_MULTI_KEYWORD;
                } while (_Var6);
                sVar8 = sysbvm_sourcePosition_createWithIndices
                                  (context,local_88.sourceCode,local_88.position,local_a8.position);
                sVar9 = sysbvm_symbol_internWithString
                                  (context,local_a8.position - sVar4,(char *)(local_88.text + sVar4)
                                  );
                goto LAB_0013fe12;
              }
            }
          }
LAB_0013fdd4:
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_a8.sourceCode,sVar4,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - sVar4,(char *)(local_88.text + sVar4));
          sVar13 = SYSBVM_TOKEN_KIND_IDENTIFIER;
          goto LAB_0013fe12;
        }
        if (9 < uVar15 - 0x30) {
          switch(uVar15) {
          case 0x22:
switchD_0013efaa_caseD_22:
LAB_0013efec:
            uVar7 = local_a8.position;
            local_a8.position = uVar7 + 1;
            uVar15 = 0xffffffff;
            if (local_a8.position < local_a8.size) {
              uVar15 = (uint)local_a8.text[local_a8.position];
            }
            if ((uVar15 != 0x22) && (-1 < (int)uVar15)) goto code_r0x0013f016;
            if ((local_a8.position < local_a8.size) && (local_a8.text[local_a8.position] == '\"')) {
              sVar13 = SYSBVM_TOKEN_KIND_STRING;
              tokenConversionFunction = sysbvm_scanner_tokenAsString;
LAB_0013f1fe:
              local_a8.position = uVar7 + 2;
              sysbvm_scanner_emitTokenForStateRange
                        (context,&local_88,&local_a8,sVar13,tokenConversionFunction,
                         orderedCollection);
              goto LAB_0013fe28;
            }
            goto LAB_0013f35c;
          case 0x23:
switchD_0013efaa_caseD_23:
            uVar12 = 0xffffffff;
            if (local_a8.position + 1 < local_a8.size) {
              uVar12 = (uint)local_a8.text[local_a8.position + 1];
            }
            if ((uVar12 == 0x5f) || ((uVar12 & 0xffffffdf) - 0x41 < 0x1a)) {
              uVar7 = local_a8.position + 2;
              do {
                local_a8.position = uVar7;
                uVar15 = 0xffffffff;
                if (local_a8.position < local_a8.size) {
                  uVar15 = (uint)local_a8.text[local_a8.position];
                }
                uVar7 = local_a8.position + 1;
              } while (((uVar15 - 0x30 < 10) || (uVar15 == 0x5f)) ||
                      ((uVar15 & 0xffffffdf) - 0x41 < 0x1a));
              if (local_a8.position < local_a8.size) {
                bVar17 = local_a8.text[local_a8.position] == ':';
                bVar16 = true;
                if (bVar17) {
                  for (; (uVar7 < local_a8.size && (local_a8.text[uVar7] == ':')); uVar7 = uVar7 + 1
                      ) {
                    uVar7 = local_a8.position + 2;
                    uVar15 = 0xffffffff;
                    if (uVar7 < local_a8.size) {
                      uVar15 = (uint)local_a8.text[uVar7];
                    }
                    if ((uVar15 != 0x5f) && (0x19 < (uVar15 & 0xffffffdf) - 0x41)) {
                      uVar15 = 0xffffffff;
                      if (uVar7 < local_a8.size) {
                        uVar15 = (uint)local_a8.text[uVar7];
                      }
                      if ((((0x3d < uVar15 - 0x21) ||
                           ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) == 0)) &&
                          (uVar15 != 0x7e)) && (uVar15 != 0x7c)) break;
                    }
                    uVar15 = 0xffffffff;
                    if (uVar7 < local_a8.size) {
                      uVar15 = (uint)local_a8.text[uVar7];
                    }
                    local_a8.position = uVar7;
                    if (((uVar15 - 0x21 < 0x3e) &&
                        ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) != 0)) ||
                       ((uVar15 == 0x7c || (uVar15 == 0x7e)))) goto LAB_0013f505;
                    while( true ) {
                      uVar15 = 0xffffffff;
                      bVar16 = uVar7 < local_a8.size;
                      if (bVar16) {
                        uVar15 = (uint)local_a8.text[uVar7];
                      }
                      if (((9 < uVar15 - 0x30) && (uVar15 != 0x5f)) &&
                         (0x19 < (uVar15 & 0xffffffdf) - 0x41)) break;
                      uVar7 = uVar7 + 1;
                    }
                    local_a8.position = uVar7;
                    if (local_a8.size <= uVar7) goto LAB_0013f535;
                    bVar17 = local_a8.text[uVar7] == ':';
                    if (!bVar17) break;
                  }
                }
                if ((bVar16) && (bVar17)) {
                  local_a8.position = local_a8.position + 1;
                  do {
                    _Var6 = sysbvm_scanner_advanceKeyword(&local_a8);
                  } while (_Var6);
                }
              }
              goto LAB_0013f535;
            }
            uVar15 = 0x23;
            bVar16 = true;
            if ((int)uVar12 < 0x7b) {
              uVar7 = (ulong)(uVar12 - 0x25);
              if (uVar12 - 0x25 < 0x3a) {
                if ((0x28000000f800563U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0013f100;
                if (uVar7 == 3) {
                  local_a8.position = local_a8.position + 2;
                  sVar8 = sysbvm_sourcePosition_createWithIndices
                                    (context,local_a8.sourceCode,sVar4,local_a8.position);
                  sVar9 = sysbvm_symbol_internWithString
                                    (context,local_a8.position - local_88.position,
                                     (char *)(local_88.text + local_88.position));
                  sVar13 = SYSBVM_TOKEN_KIND_LITERAL_ARRAY_START;
                }
                else {
                  if (uVar7 != 0x36) goto LAB_0013fcf6;
                  local_a8.position = local_a8.position + 2;
                  sVar8 = sysbvm_sourcePosition_createWithIndices
                                    (context,local_a8.sourceCode,sVar4,local_a8.position);
                  sVar9 = sysbvm_symbol_internWithString
                                    (context,local_a8.position - local_88.position,
                                     (char *)(local_88.text + local_88.position));
                  sVar13 = SYSBVM_TOKEN_KIND_BYTE_ARRAY_START;
                }
LAB_0013f177:
                sVar8 = sysbvm_token_createWithKind(context,sVar13,sVar8,sVar9);
                sysbvm_orderedCollection_add(context,orderedCollection,sVar8);
              }
              else {
LAB_0013fcf6:
                if (uVar12 == 0x21) goto LAB_0013f100;
                if (uVar12 != 0x22) goto LAB_0013f599;
                local_a8.position = local_a8.position + 2;
                while( true ) {
                  uVar15 = 0xffffffff;
                  if (local_a8.position < local_a8.size) {
                    uVar15 = (uint)local_a8.text[local_a8.position];
                  }
                  if ((uVar15 == 0x22) || ((int)uVar15 < 0)) {
                    if ((local_a8.position < local_a8.size) &&
                       (local_a8.text[local_a8.position] == '\"')) {
                      local_a8.position = local_a8.position + 1;
                      sysbvm_scanner_emitTokenForStateRange
                                (context,&local_88,&local_a8,SYSBVM_TOKEN_KIND_SYMBOL,
                                 sysbvm_scanner_tokenAsSymbolString,orderedCollection);
                      goto LAB_0013f597;
                    }
                    sVar8 = sysbvm_sourcePosition_createWithIndices
                                      (context,local_a8.sourceCode,sVar4,local_a8.position);
                    sVar9 = sysbvm_symbol_internWithCString(context,"Incomplete string.");
                    sVar13 = SYSBVM_TOKEN_KIND_ERROR;
                    goto LAB_0013f177;
                  }
                  if ((uVar15 == 0x5c) &&
                     (local_a8.position = local_a8.position + 1, local_a8.size <= local_a8.position)
                     ) break;
                  local_a8.position = local_a8.position + 1;
                }
                sVar8 = sysbvm_sourcePosition_createWithIndices
                                  (context,local_a8.sourceCode,sVar4,local_a8.position);
                sVar9 = sysbvm_symbol_internWithCString(context,"Incomplete string.");
                sVar8 = sysbvm_token_createWithKind(context,SYSBVM_TOKEN_KIND_ERROR,sVar8,sVar9);
                sysbvm_orderedCollection_add(context,orderedCollection,sVar8);
                uVar15 = 0x5c;
              }
              goto LAB_0013f597;
            }
            if (uVar12 == 0x7b) {
              local_a8.position = local_a8.position + 2;
              sVar8 = sysbvm_sourcePosition_createWithIndices
                                (context,local_a8.sourceCode,sVar4,local_a8.position);
              sVar9 = sysbvm_symbol_internWithString
                                (context,local_a8.position - local_88.position,
                                 (char *)(local_88.text + local_88.position));
              sVar13 = SYSBVM_TOKEN_KIND_DICTIONARY_START;
              goto LAB_0013f177;
            }
            if ((uVar12 == 0x7e) || (uVar12 == 0x7c)) {
LAB_0013f100:
              local_a8.position = local_a8.position + 2;
              while( true ) {
                uVar12 = 0xffffffff;
                if (local_a8.position < local_a8.size) {
                  uVar12 = (uint)local_a8.text[local_a8.position];
                }
                if ((((0x3d < uVar12 - 0x21) ||
                     ((0x28000000f8005631U >> ((ulong)(uVar12 - 0x21) & 0x3f) & 1) == 0)) &&
                    (uVar12 != 0x7c)) && (uVar12 != 0x7e)) break;
                local_a8.position = local_a8.position + 1;
              }
              sVar8 = sysbvm_sourcePosition_createWithIndices
                                (context,local_a8.sourceCode,sVar4,local_a8.position);
              sVar9 = sysbvm_symbol_internWithString
                                (context,~local_88.position + local_a8.position,
                                 (char *)(local_88.text + local_88.position + 1));
              sVar13 = SYSBVM_TOKEN_KIND_SYMBOL;
              goto LAB_0013f177;
            }
            goto LAB_0013f599;
          case 0x27:
switchD_0013efaa_caseD_27:
            do {
              uVar7 = local_a8.position;
              local_a8.position = uVar7 + 1;
              uVar15 = 0xffffffff;
              if (local_a8.position < local_a8.size) {
                uVar15 = (uint)local_a8.text[local_a8.position];
              }
              if ((uVar15 == 0x27) || ((int)uVar15 < 0)) {
                if ((local_a8.position < local_a8.size) &&
                   (local_a8.text[local_a8.position] == '\'')) {
                  sVar13 = SYSBVM_TOKEN_KIND_CHARACTER;
                  tokenConversionFunction = sysbvm_scanner_tokenAsCharacter;
                  goto LAB_0013f1fe;
                }
                break;
              }
            } while ((uVar15 != 0x5c) ||
                    (local_a8.position = uVar7 + 2, local_a8.position < local_a8.size));
            sVar8 = sysbvm_sourcePosition_createWithIndices
                              (context,local_a8.sourceCode,sVar4,local_a8.position);
            cstring = "Incomplete character.";
            goto LAB_0013f36e;
          case 0x2b:
          case 0x2d:
            if ((local_a8.position + 1 < local_a8.size) &&
               (local_a8.text[local_a8.position + 1] - 0x30 < 10)) goto LAB_0013eca9;
            if (uVar15 == 0x27) goto switchD_0013efaa_caseD_27;
            if (uVar15 == 0x23) goto switchD_0013efaa_caseD_23;
            if (uVar15 == 0x22) goto switchD_0013efaa_caseD_22;
          }
          goto switchD_0013efaa_caseD_24;
        }
LAB_0013eca9:
        uVar7 = local_a8.position;
        uVar14 = local_a8.position + 2;
        do {
          local_a8.position = uVar14;
          uVar10 = uVar7;
          uVar7 = uVar10 + 1;
          uVar15 = 0xffffffff;
          if (uVar7 < local_a8.size) {
            uVar15 = (uint)local_a8.text[uVar10 + 1];
          }
          uVar14 = local_a8.position + 1;
        } while (uVar15 == 0x5f || uVar15 - 0x30 < 10);
        if (uVar7 < local_a8.size) {
          uVar3 = local_a8.text[uVar7];
          if (uVar3 == '.') {
            uVar15 = 0xffffffff;
            if (((local_a8.size <= uVar10 + 2) ||
                (uVar15 = (uint)local_a8.text[uVar10 + 2], 9 < local_a8.text[uVar10 + 2] - 0x30)) &&
               (((uVar15 != 0x2d && (uVar15 != 0x2b)) ||
                ((local_a8.size <= uVar10 + 3 || (9 < local_a8.text[uVar10 + 3] - 0x30))))))
            goto LAB_0013ed0d;
            uVar15 = 0xffffffff;
            if (uVar10 + 3 < local_a8.size) {
              uVar15 = (uint)local_a8.text[uVar10 + 3];
            }
            if ((uVar15 == 0x2d) || (uVar7 = uVar10 + 2, uVar15 == 0x2b)) {
              uVar7 = uVar10 + 3;
            }
            do {
              uVar14 = uVar7;
              uVar7 = uVar14 + 1;
              uVar15 = 0xffffffff;
              if (uVar7 < local_a8.size) {
                uVar15 = (uint)local_a8.text[uVar14 + 1];
              }
            } while (uVar15 == 0x5f || uVar15 - 0x30 < 10);
            local_a8.position = uVar7;
            if ((uVar7 < local_a8.size) && ((local_a8.text[uVar7] | 0x20) == 0x65)) {
              local_a8.position = uVar14 + 2;
              if ((local_a8.position < local_a8.size) &&
                 ((local_a8.text[uVar14 + 2] == '-' || (local_a8.text[uVar14 + 2] == '+')))) {
                local_a8.position = uVar7;
              }
              while( true ) {
                uVar15 = 0xffffffff;
                if (local_a8.position < local_a8.size) {
                  uVar15 = (uint)local_a8.text[local_a8.position];
                }
                if (uVar15 != 0x5f && 9 < uVar15 - 0x30) break;
                local_a8.position = local_a8.position + 1;
              }
            }
            sVar8 = sysbvm_sourcePosition_createWithIndices
                              (context,local_a8.sourceCode,sVar4,local_a8.position);
            sVar9 = sysbvm_float64_parseString
                              (context,local_a8.position - local_88.position,
                               (char *)(local_88.text + local_88.position));
            sVar13 = SYSBVM_TOKEN_KIND_FLOAT;
          }
          else {
            if ((uVar3 != 'r') && (uVar3 != 'R')) goto LAB_0013ed0d;
            while( true ) {
              uVar15 = 0xffffffff;
              if (local_a8.position < local_a8.size) {
                uVar15 = (uint)local_a8.text[local_a8.position];
              }
              if (((9 < uVar15 - 0x30) && (uVar15 != 0x5f)) && (0x19 < (uVar15 & 0xffffffdf) - 0x41)
                 ) break;
              local_a8.position = local_a8.position + 1;
            }
            sVar8 = sysbvm_sourcePosition_createWithIndices
                              (context,local_a8.sourceCode,sVar4,local_a8.position);
            sVar9 = sysbvm_integer_parseString
                              (context,local_a8.position - sVar4,(char *)(local_88.text + sVar4));
            sVar13 = SYSBVM_TOKEN_KIND_INTEGER;
          }
        }
        else {
LAB_0013ed0d:
          local_a8.position = uVar7;
          sVar8 = sysbvm_sourcePosition_createWithIndices(context,local_a8.sourceCode,sVar4,uVar7);
          sVar9 = sysbvm_integer_parseString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_INTEGER;
        }
        goto LAB_0013fe12;
      }
    }
  }
LAB_00140110:
  sStack_60 = sysbvm_orderedCollection_asArraySlice(context,local_68);
  sysbvm_gc_unlock(context);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_60;
LAB_0013f505:
  while( true ) {
    uVar15 = 0xffffffff;
    if (local_a8.position < local_a8.size) {
      uVar15 = (uint)local_a8.text[local_a8.position];
    }
    if (((0x3d < uVar15 - 0x21) ||
        ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) == 0)) &&
       ((uVar15 != 0x7c && (uVar15 != 0x7e)))) break;
    local_a8.position = local_a8.position + 1;
  }
LAB_0013f535:
  sVar8 = sysbvm_sourcePosition_createWithIndices
                    (context,local_88.sourceCode,local_88.position,local_a8.position);
  sVar9 = sysbvm_symbol_internWithString
                    (context,~local_88.position + local_a8.position,
                     (char *)(local_88.text + local_88.position + 1));
  sVar8 = sysbvm_token_createWithKind(context,SYSBVM_TOKEN_KIND_SYMBOL,sVar8,sVar9);
  sysbvm_orderedCollection_add(context,orderedCollection,sVar8);
  uVar15 = 0x23;
LAB_0013f597:
  bVar16 = false;
LAB_0013f599:
  if (!bVar16) goto LAB_0013fe28;
switchD_0013efaa_caseD_24:
  sVar11 = local_a8.position;
  sVar4 = local_a8.size;
  if ((int)uVar15 < 0x5b) {
    switch(uVar15) {
    case 0x28:
      local_a8.position = local_a8.position + 1;
      sVar8 = sysbvm_sourcePosition_createWithIndices
                        (context,local_88.sourceCode,local_88.position,local_a8.position);
      sVar9 = sysbvm_symbol_internWithString
                        (context,local_a8.position - local_88.position,
                         (char *)(local_88.text + local_88.position));
      sVar13 = SYSBVM_TOKEN_KIND_LPARENT;
      break;
    case 0x29:
      local_a8.position = local_a8.position + 1;
      sVar8 = sysbvm_sourcePosition_createWithIndices
                        (context,local_88.sourceCode,local_88.position,local_a8.position);
      sVar9 = sysbvm_symbol_internWithString
                        (context,local_a8.position - local_88.position,
                         (char *)(local_88.text + local_88.position));
      sVar13 = SYSBVM_TOKEN_KIND_RPARENT;
      break;
    case 0x2a:
    case 0x2b:
    case 0x2d:
switchD_0013f5c7_caseD_2a:
      uVar12 = 0xffffffff;
      if (local_a8.position < local_a8.size) {
        uVar12 = (uint)local_a8.text[local_a8.position];
      }
      _Var6 = sysbvm_scanner_isOperatorCharacter(uVar12);
      if (!_Var6) {
LAB_0013fc31:
        local_a8.position = local_a8.position + 1;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        cstring = "Unrecognized token.";
        goto LAB_0013f36e;
      }
      while( true ) {
        uVar12 = 0xffffffff;
        if (sVar11 < sVar4) {
          uVar12 = (uint)local_a8.text[sVar11];
        }
        if ((((0x3d < uVar12 - 0x21) ||
             ((0x28000000f8005631U >> ((ulong)(uVar12 - 0x21) & 0x3f) & 1) == 0)) &&
            (uVar12 != 0x7c)) && (uVar12 != 0x7e)) break;
        sVar11 = sVar11 + 1;
        local_a8.position = sVar11;
      }
      if (local_88.position + 1 == sVar11) {
        if (uVar15 == 0x2a) {
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_STAR;
        }
        else if (uVar15 == 0x3e) {
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_GREATER_THAN;
        }
        else {
          if (uVar15 != 0x3c) goto LAB_0013fe42;
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_LESS_THAN;
        }
      }
      else {
LAB_0013fe42:
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_OPERATOR;
      }
      break;
    case 0x2c:
      local_a8.position = local_a8.position + 1;
      sVar8 = sysbvm_sourcePosition_createWithIndices
                        (context,local_88.sourceCode,local_88.position,local_a8.position);
      sVar9 = sysbvm_symbol_internWithString
                        (context,local_a8.position - local_88.position,
                         (char *)(local_88.text + local_88.position));
      sVar13 = SYSBVM_TOKEN_KIND_COMMA;
      break;
    case 0x2e:
      uVar7 = local_a8.position + 1;
      if (((uVar7 < local_a8.size) && (local_a8.text[uVar7] == '.')) &&
         ((local_a8.position + 2 < local_a8.size && (local_a8.text[local_a8.position + 2] == '.'))))
      {
        local_a8.position = local_a8.position + 3;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_ELLIPSIS;
      }
      else {
        local_a8.position = uVar7;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,uVar7);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_DOT;
      }
      break;
    default:
      if (uVar15 == 0x3a) {
        uVar7 = local_a8.position + 1;
        if (uVar7 < local_a8.size) {
          if (local_a8.text[uVar7] == '=') {
            local_a8.position = local_a8.position + 2;
            sVar8 = sysbvm_sourcePosition_createWithIndices
                              (context,local_88.sourceCode,local_88.position,local_a8.position);
            sVar9 = sysbvm_symbol_internWithString
                              (context,local_a8.position - local_88.position,
                               (char *)(local_88.text + local_88.position));
            sVar13 = SYSBVM_TOKEN_KIND_ASSIGNMENT;
          }
          else {
            if (local_a8.text[uVar7] != ':') goto LAB_0013fb9f;
            local_a8.position = local_a8.position + 2;
            sVar8 = sysbvm_sourcePosition_createWithIndices
                              (context,local_88.sourceCode,local_88.position,local_a8.position);
            sVar9 = sysbvm_symbol_internWithString
                              (context,local_a8.position - local_88.position,
                               (char *)(local_88.text + local_88.position));
            sVar13 = SYSBVM_TOKEN_KIND_COLON_COLON;
          }
        }
        else {
LAB_0013fb9f:
          local_a8.position = uVar7;
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,uVar7);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_COLON;
        }
      }
      else {
        if (uVar15 != 0x3b) goto switchD_0013f5c7_caseD_2a;
        local_a8.position = local_a8.position + 1;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_SEMICOLON;
      }
    }
  }
  else if ((int)uVar15 < 0x7b) {
    if (uVar15 == 0x5b) {
      local_a8.position = local_a8.position + 1;
      sVar8 = sysbvm_sourcePosition_createWithIndices
                        (context,local_88.sourceCode,local_88.position,local_a8.position);
      sVar9 = sysbvm_symbol_internWithString
                        (context,local_a8.position - local_88.position,
                         (char *)(local_88.text + local_88.position));
      sVar13 = SYSBVM_TOKEN_KIND_LBRACKET;
    }
    else if (uVar15 == 0x5d) {
      local_a8.position = local_a8.position + 1;
      sVar8 = sysbvm_sourcePosition_createWithIndices
                        (context,local_88.sourceCode,local_88.position,local_a8.position);
      sVar9 = sysbvm_symbol_internWithString
                        (context,local_a8.position - local_88.position,
                         (char *)(local_88.text + local_88.position));
      sVar13 = SYSBVM_TOKEN_KIND_RBRACKET;
    }
    else {
      if (uVar15 != 0x60) goto switchD_0013f5c7_caseD_2a;
      uVar15 = 0xffffffff;
      if (local_a8.position + 1 < local_a8.size) {
        uVar15 = (uint)local_a8.text[local_a8.position + 1];
      }
      if ((int)uVar15 < 0x40) {
        if (uVar15 == 0x27) {
          local_a8.position = local_a8.position + 2;
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_QUOTE;
        }
        else {
          if (uVar15 != 0x2c) goto LAB_0013fc31;
          local_a8.position = local_a8.position + 2;
          sVar8 = sysbvm_sourcePosition_createWithIndices
                            (context,local_88.sourceCode,local_88.position,local_a8.position);
          sVar9 = sysbvm_symbol_internWithString
                            (context,local_a8.position - local_88.position,
                             (char *)(local_88.text + local_88.position));
          sVar13 = SYSBVM_TOKEN_KIND_QUASI_UNQUOTE;
        }
      }
      else if (uVar15 == 0x40) {
        local_a8.position = local_a8.position + 2;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_SPLICE;
      }
      else {
        if (uVar15 != 0x60) goto LAB_0013fc31;
        local_a8.position = local_a8.position + 2;
        sVar8 = sysbvm_sourcePosition_createWithIndices
                          (context,local_88.sourceCode,local_88.position,local_a8.position);
        sVar9 = sysbvm_symbol_internWithString
                          (context,local_a8.position - local_88.position,
                           (char *)(local_88.text + local_88.position));
        sVar13 = SYSBVM_TOKEN_KIND_QUASI_QUOTE;
      }
    }
  }
  else if (uVar15 == 0x7b) {
    local_a8.position = local_a8.position + 1;
    sVar8 = sysbvm_sourcePosition_createWithIndices
                      (context,local_88.sourceCode,local_88.position,local_a8.position);
    sVar9 = sysbvm_symbol_internWithString
                      (context,local_a8.position - local_88.position,
                       (char *)(local_88.text + local_88.position));
    sVar13 = SYSBVM_TOKEN_KIND_LCBRACKET;
  }
  else if (uVar15 == 0x7c) {
    uVar7 = local_a8.position + 1;
    uVar15 = 0xffffffff;
    if (uVar7 < local_a8.size) {
      uVar15 = (uint)local_a8.text[uVar7];
    }
    local_a8.position = uVar7;
    _Var6 = sysbvm_scanner_isOperatorCharacter(uVar15);
    if (_Var6) {
      while( true ) {
        uVar15 = 0xffffffff;
        if (uVar7 < sVar4) {
          uVar15 = (uint)local_a8.text[uVar7];
        }
        if (((0x3d < uVar15 - 0x21) ||
            ((0x28000000f8005631U >> ((ulong)(uVar15 - 0x21) & 0x3f) & 1) == 0)) &&
           ((uVar15 != 0x7c && (uVar15 != 0x7e)))) break;
        uVar7 = uVar7 + 1;
        local_a8.position = uVar7;
      }
      goto LAB_0013fe42;
    }
    sVar8 = sysbvm_sourcePosition_createWithIndices
                      (context,local_88.sourceCode,local_88.position,uVar7);
    sVar9 = sysbvm_symbol_internWithString
                      (context,local_a8.position - local_88.position,
                       (char *)(local_88.text + local_88.position));
    sVar13 = SYSBVM_TOKEN_KIND_BAR;
  }
  else {
    if (uVar15 != 0x7d) goto switchD_0013f5c7_caseD_2a;
    local_a8.position = local_a8.position + 1;
    sVar8 = sysbvm_sourcePosition_createWithIndices
                      (context,local_88.sourceCode,local_88.position,local_a8.position);
    sVar9 = sysbvm_symbol_internWithString
                      (context,local_a8.position - local_88.position,
                       (char *)(local_88.text + local_88.position));
    sVar13 = SYSBVM_TOKEN_KIND_RCBRACKET;
  }
LAB_0013fe12:
  sVar8 = sysbvm_token_createWithKind(context,sVar13,sVar8,sVar9);
  sysbvm_orderedCollection_add(context,orderedCollection,sVar8);
LAB_0013fe28:
  orderedCollection = local_68;
  if (local_a8.size <= local_a8.position) goto LAB_00140110;
  goto LAB_0013eac9;
code_r0x0013f016:
  if ((uVar15 != 0x5c) || (local_a8.position = uVar7 + 2, local_a8.position < local_a8.size))
  goto LAB_0013efec;
LAB_0013f35c:
  sVar8 = sysbvm_sourcePosition_createWithIndices
                    (context,local_a8.sourceCode,sVar4,local_a8.position);
  cstring = "Incomplete string.";
LAB_0013f36e:
  sVar9 = sysbvm_symbol_internWithCString(context,cstring);
  sVar13 = SYSBVM_TOKEN_KIND_ERROR;
  goto LAB_0013fe12;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t tokenList;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);

    gcFrame.tokenList = sysbvm_orderedCollection_create(context);

    if(sysbvm_tuple_isNonNullPointer(sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        if(sysbvm_tuple_isBytes(sourceCodeObject->text))
        {
            sysbvm_scannerState_t scannerState = {
                .sourceCode = sourceCode,
                .text = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCodeObject->text)->bytes,
                .size = sysbvm_tuple_getSizeInBytes(sourceCodeObject->text),
                .position = 0
            };

            while(scannerState.position < scannerState.size)
            {
                if(!sysbvm_scanner_scanNextTokenInto(context, &scannerState, gcFrame.tokenList))
                    break;
            }
        }
    }

    gcFrame.result = sysbvm_orderedCollection_asArraySlice(context, gcFrame.tokenList);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}